

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psnr.c
# Opt level: O2

int64_t encoder_highbd_sse(uint8_t *a8,int a_stride,uint8_t *b8,int b_stride,int w,int h)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  int j;
  ulong uVar7;
  
  lVar4 = (long)a8 * 2;
  lVar2 = (long)b8 * 2;
  uVar1 = 0;
  uVar5 = (ulong)(uint)w;
  if (w < 1) {
    uVar5 = uVar1;
  }
  if (h < 1) {
    h = 0;
  }
  for (iVar6 = 0; iVar6 != h; iVar6 = iVar6 + 1) {
    for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      iVar3 = (uint)*(ushort *)(lVar4 + uVar7 * 2) - (uint)*(ushort *)(lVar2 + uVar7 * 2);
      uVar1 = uVar1 + (uint)(iVar3 * iVar3);
    }
    lVar2 = lVar2 + (long)b_stride * 2;
    lVar4 = lVar4 + (long)a_stride * 2;
  }
  return uVar1;
}

Assistant:

static int64_t encoder_highbd_sse(const uint8_t *a8, int a_stride,
                                  const uint8_t *b8, int b_stride, int w,
                                  int h) {
  const uint16_t *a = CONVERT_TO_SHORTPTR(a8);
  const uint16_t *b = CONVERT_TO_SHORTPTR(b8);
  int64_t sse = 0;
  for (int i = 0; i < h; ++i) {
    for (int j = 0; j < w; ++j) {
      const int diff = a[j] - b[j];
      sse += diff * diff;
    }
    a += a_stride;
    b += b_stride;
  }
  return sse;
}